

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[45],kj::CappedArray<char,17ul>&,char_const(&)[8],kj::Array<kj::StringTree>,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [45],
          CappedArray<char,_17UL> *params_1,char (*params_2) [8],Array<kj::StringTree> *params_3,
          char (*params_4) [4])

{
  char (*value) [45];
  CappedArray<char,_17UL> *value_00;
  char (*value_01) [8];
  Array<kj::StringTree> *this_00;
  char (*value_02) [4];
  Array<kj::StringTree> *value_03;
  ArrayPtr<const_char> *in_stack_ffffffffffffff18;
  ArrayPtr<const_char> local_b0;
  StringTree local_a0;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  Array<kj::StringTree> *local_38;
  char (*params_local_4) [4];
  Array<kj::StringTree> *params_local_3;
  char (*params_local_2) [8];
  CappedArray<char,_17UL> *params_local_1;
  char (*params_local) [45];
  
  local_38 = params_3;
  params_local_4 = (char (*) [4])params_2;
  params_local_3 = (Array<kj::StringTree> *)params_1;
  params_local_2 = (char (*) [8])params;
  params_local_1 = (CappedArray<char,_17UL> *)this;
  params_local = (char (*) [45])__return_storage_ptr__;
  value = ::const((char (*) [45])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[45]>(value);
  value_00 = fwd<kj::CappedArray<char,17ul>&>((CappedArray<char,_17UL> *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>&>(value_00);
  value_01 = ::const((char (*) [8])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[8]>(value_01);
  this_00 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_local_4);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_a0,(_ *)this_00,value_03);
  value_02 = ::const((char (*) [4])local_38);
  local_b0 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_48,&local_58,&local_68,
             (ArrayPtr<const_char> *)&local_a0,(StringTree *)&local_b0,in_stack_ffffffffffffff18);
  StringTree::~StringTree(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}